

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O3

void xmlSAX2AttributeInternal(void *ctx,xmlChar *fullname,xmlChar *value,xmlChar *prefix)

{
  code *pcVar1;
  int iVar2;
  uint uVar3;
  xmlChar *pxVar4;
  xmlURIPtr pxVar5;
  xmlURIPtr pxVar6;
  xmlURIPtr pxVar7;
  xmlNsPtr pxVar8;
  _xmlNode *attr;
  xmlNodePtr pxVar9;
  _xmlNode *p_Var10;
  xmlChar *pxVar11;
  xmlDocPtr pxVar12;
  long lVar13;
  xmlChar *ns;
  xmlURIPtr local_40;
  xmlURIPtr local_38;
  
  if (*(int *)((long)ctx + 0x34) == 0) {
    pxVar4 = xmlSplitQName((xmlParserCtxtPtr)ctx,fullname,(xmlChar **)&local_40);
    if (pxVar4 != (xmlChar *)0x0) {
      if (*pxVar4 == '\0') {
        iVar2 = xmlStrEqual((xmlChar *)local_40,"xmlns");
        if (iVar2 == 0) {
          xmlNsWarnMsg((xmlParserCtxtPtr)ctx,XML_WAR_NS_COLUMN,
                       "Avoid attribute ending with \':\' like \'%s\'\n",fullname,(xmlChar *)0x0);
        }
        else {
          xmlNsErrMsg((xmlParserCtxtPtr)ctx,XML_ERR_NS_DECL_ERROR,
                      "invalid namespace declaration \'%s\'\n",fullname,(xmlChar *)0x0);
        }
        if (local_40 != (xmlURIPtr)0x0) {
          (*xmlFree)(local_40);
        }
        local_40 = (xmlURIPtr)0x0;
        (*xmlFree)(pxVar4);
        pxVar4 = xmlStrdup(fullname);
        goto LAB_00180c7b;
      }
      goto LAB_00180ca3;
    }
LAB_00180cca:
    xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElement");
    pxVar6 = local_40;
  }
  else {
    pxVar4 = xmlStrdup(fullname);
    local_40 = (xmlURIPtr)0x0;
LAB_00180c7b:
    if (pxVar4 == (xmlChar *)0x0) goto LAB_00180cca;
LAB_00180ca3:
    if (((value == (xmlChar *)0x0) && (*(int *)((long)ctx + 0x34) != 0)) &&
       (iVar2 = htmlIsBooleanAttr(fullname), iVar2 != 0)) {
      pxVar5 = (xmlURIPtr)xmlStrdup(fullname);
      value = (xmlChar *)pxVar5;
    }
    else {
      *(undefined4 *)((long)ctx + 0xe0) = 1;
      pxVar5 = (xmlURIPtr)
               xmlValidCtxtNormalizeAttributeValue
                         ((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),
                          *(xmlNodePtr *)((long)ctx + 0x50),fullname,value);
      if (*(int *)((long)ctx + 0xe0) != 1) {
        *(undefined4 *)((long)ctx + 0x98) = 0;
      }
      if (pxVar5 != (xmlURIPtr)0x0) {
        value = (xmlChar *)pxVar5;
      }
    }
    pxVar6 = (xmlURIPtr)value;
    if (local_40 == (xmlURIPtr)0x0 && *(int *)((long)ctx + 0x34) == 0) {
      if (((((*pxVar4 != 'x') || (pxVar4[1] != 'm')) || (pxVar4[2] != 'l')) ||
          ((pxVar4[3] != 'n' || (pxVar4[4] != 's')))) || (pxVar4[5] != '\0')) {
LAB_00180fe4:
        pxVar8 = (xmlNsPtr)0x0;
        goto LAB_00180fe7;
      }
      if (*(int *)((long)ctx + 0x1c) != 0) {
LAB_00180dc0:
        if (*(char *)&pxVar6->scheme != '\0') {
          pxVar7 = xmlParseURI((char *)pxVar6);
          if (pxVar7 == (xmlURIPtr)0x0) {
            if ((*ctx != 0) && (pcVar1 = *(code **)(*ctx + 0xa8), pcVar1 != (code *)0x0)) {
              (*pcVar1)(*(undefined8 *)((long)ctx + 8),"xmlns: %s not a valid URI\n",pxVar6);
            }
          }
          else {
            if (((pxVar7->scheme == (char *)0x0) && (*ctx != 0)) &&
               (pcVar1 = *(code **)(*ctx + 0xa8), pcVar1 != (code *)0x0)) {
              local_38 = pxVar7;
              (*pcVar1)(*(undefined8 *)((long)ctx + 8),"xmlns: URI %s is not absolute\n",pxVar6);
              pxVar7 = local_38;
            }
            xmlFreeURI(pxVar7);
          }
        }
        pxVar8 = xmlNewNs(*(xmlNodePtr *)((long)ctx + 0x50),(xmlChar *)pxVar6,(xmlChar *)0x0);
        if (((pxVar8 != (xmlNsPtr)0x0) && (*(int *)((long)ctx + 0x9c) != 0)) &&
           ((*(int *)((long)ctx + 0x18) != 0 &&
            ((pxVar12 = *(xmlDocPtr *)((long)ctx + 0x10), pxVar12 != (xmlDocPtr)0x0 &&
             (pxVar12->intSubset != (_xmlDtd *)0x0)))))) {
          uVar3 = xmlValidateOneNamespace
                            ((xmlValidCtxtPtr)((long)ctx + 0xa0),pxVar12,
                             *(xmlNodePtr *)((long)ctx + 0x50),prefix,pxVar8,(xmlChar *)pxVar6);
          *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar3;
        }
LAB_00181475:
        (*xmlFree)(pxVar4);
        if (pxVar5 != (xmlURIPtr)0x0) {
          (*xmlFree)(pxVar5);
        }
        if (pxVar6 == (xmlURIPtr)value) {
          return;
        }
        goto LAB_001811f0;
      }
      *(int *)((long)ctx + 0x188) = *(int *)((long)ctx + 0x188) + 1;
      pxVar6 = (xmlURIPtr)xmlStringDecodeEntities((xmlParserCtxtPtr)ctx,value,1,'\0','\0','\0');
      *(int *)((long)ctx + 0x188) = *(int *)((long)ctx + 0x188) + -1;
      if (pxVar6 != (xmlURIPtr)0x0) goto LAB_00180dc0;
      xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElement");
      (*xmlFree)(pxVar4);
      pxVar6 = pxVar5;
    }
    else {
      if (local_40 == (xmlURIPtr)0x0 || *(int *)((long)ctx + 0x34) != 0) {
        if (local_40 == (xmlURIPtr)0x0) goto LAB_00180fe4;
      }
      else if ((((*(char *)&local_40->scheme == 'x') &&
                (*(char *)((long)&local_40->scheme + 1) == 'm')) &&
               ((*(char *)((long)&local_40->scheme + 2) == 'l' &&
                ((*(char *)((long)&local_40->scheme + 3) == 'n' &&
                 (*(char *)((long)&local_40->scheme + 4) == 's')))))) &&
              (*(char *)((long)&local_40->scheme + 5) == '\0')) {
        if (*(int *)((long)ctx + 0x1c) == 0) {
          *(int *)((long)ctx + 0x188) = *(int *)((long)ctx + 0x188) + 1;
          pxVar6 = (xmlURIPtr)xmlStringDecodeEntities((xmlParserCtxtPtr)ctx,value,1,'\0','\0','\0');
          *(int *)((long)ctx + 0x188) = *(int *)((long)ctx + 0x188) + -1;
          if (pxVar6 == (xmlURIPtr)0x0) {
            xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElement");
            (*xmlFree)(local_40);
            (*xmlFree)(pxVar4);
            pxVar6 = pxVar5;
            goto joined_r0x001811ee;
          }
        }
        if (*(char *)&pxVar6->scheme == '\0') {
          xmlNsErrMsg((xmlParserCtxtPtr)ctx,XML_NS_ERR_EMPTY,"Empty namespace name for prefix %s\n",
                      pxVar4,(xmlChar *)0x0);
        }
        if ((*(int *)((long)ctx + 0x1a4) != 0) && (*(char *)&pxVar6->scheme != '\0')) {
          pxVar7 = xmlParseURI((char *)pxVar6);
          if (pxVar7 == (xmlURIPtr)0x0) {
            xmlNsWarnMsg((xmlParserCtxtPtr)ctx,XML_WAR_NS_URI,"xmlns:%s: %s not a valid URI\n",
                         pxVar4,value);
          }
          else {
            if (pxVar7->scheme == (char *)0x0) {
              local_38 = pxVar7;
              xmlNsWarnMsg((xmlParserCtxtPtr)ctx,XML_WAR_NS_URI_RELATIVE,
                           "xmlns:%s: URI %s is not absolute\n",pxVar4,value);
              pxVar7 = local_38;
            }
            xmlFreeURI(pxVar7);
          }
        }
        local_38 = (xmlURIPtr)xmlNewNs(*(xmlNodePtr *)((long)ctx + 0x50),(xmlChar *)pxVar6,pxVar4);
        (*xmlFree)(local_40);
        if ((((local_38 != (xmlURIPtr)0x0) && (*(int *)((long)ctx + 0x9c) != 0)) &&
            (*(int *)((long)ctx + 0x18) != 0)) &&
           ((pxVar12 = *(xmlDocPtr *)((long)ctx + 0x10), pxVar12 != (xmlDocPtr)0x0 &&
            (pxVar12->intSubset != (_xmlDtd *)0x0)))) {
          uVar3 = xmlValidateOneNamespace
                            ((xmlValidCtxtPtr)((long)ctx + 0xa0),pxVar12,
                             *(xmlNodePtr *)((long)ctx + 0x50),prefix,(xmlNsPtr)local_38,value);
          *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar3;
        }
        goto LAB_00181475;
      }
      pxVar8 = xmlSearchNs(*(xmlDocPtr *)((long)ctx + 0x10),*(xmlNodePtr *)((long)ctx + 0x50),
                           (xmlChar *)local_40);
      if (pxVar8 == (xmlNsPtr)0x0) {
        xmlNsErrMsg((xmlParserCtxtPtr)ctx,XML_NS_ERR_UNDEFINED_NAMESPACE,
                    "Namespace prefix %s of attribute %s is not defined\n",(xmlChar *)local_40,
                    pxVar4);
        goto LAB_00180fe4;
      }
      local_38 = pxVar5;
      for (lVar13 = *(long *)(*(long *)((long)ctx + 0x50) + 0x58); pxVar5 = local_38, lVar13 != 0;
          lVar13 = *(long *)(lVar13 + 0x30)) {
        if (((*(long *)(lVar13 + 0x48) != 0) &&
            (iVar2 = xmlStrEqual(pxVar4,*(xmlChar **)(lVar13 + 0x10)), iVar2 != 0)) &&
           ((pxVar8 == *(xmlNsPtr *)(lVar13 + 0x48) ||
            (iVar2 = xmlStrEqual(pxVar8->href,(*(xmlNsPtr *)(lVar13 + 0x48))->href), iVar2 != 0))))
        {
          xmlNsErrMsg((xmlParserCtxtPtr)ctx,XML_ERR_ATTRIBUTE_REDEFINED,
                      "Attribute %s in %s redefined\n",pxVar4,pxVar8->href);
          *(undefined4 *)((long)ctx + 0x18) = 0;
          if (*(int *)((long)ctx + 0x1c0) == 0) {
            *(undefined4 *)((long)ctx + 0x14c) = 1;
          }
          (*xmlFree)(pxVar4);
          pxVar5 = local_38;
          goto LAB_001811d5;
        }
      }
LAB_00180fe7:
      attr = (_xmlNode *)
             xmlNewNsPropEatName(*(xmlNodePtr *)((long)ctx + 0x50),pxVar8,pxVar4,(xmlChar *)0x0);
      if (attr != (_xmlNode *)0x0) {
        if ((*(int *)((long)ctx + 0x1c) == 0) && (*(int *)((long)ctx + 0x34) == 0)) {
          pxVar9 = xmlStringGetNodeList(*(xmlDoc **)((long)ctx + 0x10),value);
          attr->children = pxVar9;
          if (pxVar9 != (xmlNodePtr)0x0) {
            do {
              p_Var10 = pxVar9;
              p_Var10->parent = attr;
              pxVar9 = p_Var10->next;
            } while (p_Var10->next != (_xmlNode *)0x0);
            attr->last = p_Var10;
          }
        }
        else if ((xmlURIPtr)value != (xmlURIPtr)0x0) {
          pxVar9 = xmlNewDocText(*(xmlDoc **)((long)ctx + 0x10),value);
          attr->children = pxVar9;
          attr->last = pxVar9;
          if (pxVar9 != (xmlNodePtr)0x0) {
            pxVar9->parent = attr;
          }
        }
      }
      if ((((*(int *)((long)ctx + 0x34) == 0) && (*(int *)((long)ctx + 0x9c) != 0)) &&
          (*(int *)((long)ctx + 0x18) != 0)) &&
         ((pxVar12 = *(xmlDocPtr *)((long)ctx + 0x10), pxVar12 != (xmlDocPtr)0x0 &&
          (pxVar12->intSubset != (_xmlDtd *)0x0)))) {
        if (*(int *)((long)ctx + 0x1c) == 0) {
          *(int *)((long)ctx + 0x188) = *(int *)((long)ctx + 0x188) + 1;
          pxVar4 = xmlStringDecodeEntities((xmlParserCtxtPtr)ctx,value,1,'\0','\0','\0');
          *(int *)((long)ctx + 0x188) = *(int *)((long)ctx + 0x188) + -1;
          if (pxVar4 != (xmlChar *)0x0) {
            pxVar11 = xmlValidNormalizeAttributeValue
                                (*(xmlDocPtr *)((long)ctx + 0x10),*(xmlNodePtr *)((long)ctx + 0x50),
                                 fullname,pxVar4);
            if (pxVar11 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar4);
              pxVar4 = pxVar11;
            }
            uVar3 = xmlValidateOneAttribute
                              ((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),
                               *(xmlNodePtr *)((long)ctx + 0x50),(xmlAttrPtr)attr,pxVar4);
            *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar3;
            (*xmlFree)(pxVar4);
            goto LAB_001811d5;
          }
          pxVar12 = *(xmlDocPtr *)((long)ctx + 0x10);
        }
        uVar3 = xmlValidateOneAttribute
                          ((xmlValidCtxtPtr)((long)ctx + 0xa0),pxVar12,
                           *(xmlNodePtr *)((long)ctx + 0x50),(xmlAttrPtr)attr,value);
        *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar3;
      }
      else if ((*(byte *)((long)ctx + 0x1b0) & 8) == 0) {
        if (*(int *)((long)ctx + 0x1c) == 0) {
          if (*(int *)((long)ctx + 0x94) != 2) goto LAB_0018111c;
        }
        else if (*(int *)((long)ctx + 0x150) == 0) {
LAB_0018111c:
          iVar2 = xmlStrEqual(fullname,(xmlChar *)"xml:id");
          if (iVar2 == 0) {
            iVar2 = xmlIsID(*(xmlDocPtr *)((long)ctx + 0x10),*(xmlNodePtr *)((long)ctx + 0x50),
                            (xmlAttrPtr)attr);
            if (iVar2 == 0) {
              iVar2 = xmlIsRef(*(xmlDocPtr *)((long)ctx + 0x10),*(xmlNodePtr *)((long)ctx + 0x50),
                               (xmlAttrPtr)attr);
              if (iVar2 != 0) {
                xmlAddRef((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),value
                          ,(xmlAttrPtr)attr);
              }
              goto LAB_001811d5;
            }
          }
          else {
            iVar2 = xmlValidateNCName(value,1);
            if (iVar2 != 0) {
              xmlErrValid((xmlParserCtxtPtr)ctx,XML_DTD_XMLID_VALUE,
                          "xml:id : attribute value %s is not an NCName\n",(char *)value,(char *)0x0
                         );
            }
          }
          xmlAddID((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),value,
                   (xmlAttrPtr)attr);
        }
      }
LAB_001811d5:
      pxVar6 = local_40;
      if (pxVar5 != (xmlURIPtr)0x0) {
        (*xmlFree)(pxVar5);
        pxVar6 = local_40;
      }
    }
  }
joined_r0x001811ee:
  if (pxVar6 == (xmlURIPtr)0x0) {
    return;
  }
LAB_001811f0:
  (*xmlFree)(pxVar6);
  return;
}

Assistant:

static void
xmlSAX2AttributeInternal(void *ctx, const xmlChar *fullname,
             const xmlChar *value, const xmlChar *prefix ATTRIBUTE_UNUSED)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlAttrPtr ret;
    xmlChar *name;
    xmlChar *ns;
    xmlChar *nval;
    xmlNsPtr namespace;

    if (ctxt->html) {
	name = xmlStrdup(fullname);
	ns = NULL;
	namespace = NULL;
    } else {
	/*
	 * Split the full name into a namespace prefix and the tag name
	 */
	name = xmlSplitQName(ctxt, fullname, &ns);
	if ((name != NULL) && (name[0] == 0)) {
	    if (xmlStrEqual(ns, BAD_CAST "xmlns")) {
		xmlNsErrMsg(ctxt, XML_ERR_NS_DECL_ERROR,
			    "invalid namespace declaration '%s'\n",
			    fullname, NULL);
	    } else {
		xmlNsWarnMsg(ctxt, XML_WAR_NS_COLUMN,
			     "Avoid attribute ending with ':' like '%s'\n",
			     fullname, NULL);
	    }
	    if (ns != NULL)
		xmlFree(ns);
	    ns = NULL;
	    xmlFree(name);
	    name = xmlStrdup(fullname);
	}
    }
    if (name == NULL) {
        xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElement");
	if (ns != NULL)
	    xmlFree(ns);
	return;
    }

#ifdef LIBXML_HTML_ENABLED
    if ((ctxt->html) &&
        (value == NULL) && (htmlIsBooleanAttr(fullname))) {
            nval = xmlStrdup(fullname);
            value = (const xmlChar *) nval;
    } else
#endif
    {
#ifdef LIBXML_VALID_ENABLED
        /*
         * Do the last stage of the attribute normalization
         * Needed for HTML too:
         *   http://www.w3.org/TR/html4/types.html#h-6.2
         */
        ctxt->vctxt.valid = 1;
        nval = xmlValidCtxtNormalizeAttributeValue(&ctxt->vctxt,
                                               ctxt->myDoc, ctxt->node,
                                               fullname, value);
        if (ctxt->vctxt.valid != 1) {
            ctxt->valid = 0;
        }
        if (nval != NULL)
            value = nval;
#else
        nval = NULL;
#endif /* LIBXML_VALID_ENABLED */
    }

    /*
     * Check whether it's a namespace definition
     */
    if ((!ctxt->html) && (ns == NULL) &&
        (name[0] == 'x') && (name[1] == 'm') && (name[2] == 'l') &&
        (name[3] == 'n') && (name[4] == 's') && (name[5] == 0)) {
	xmlNsPtr nsret;
	xmlChar *val;

        if (!ctxt->replaceEntities) {
	    ctxt->depth++;
	    val = xmlStringDecodeEntities(ctxt, value, XML_SUBSTITUTE_REF,
		                          0,0,0);
	    ctxt->depth--;
	    if (val == NULL) {
	        xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElement");
		if (name != NULL)
		    xmlFree(name);
                if (nval != NULL)
                    xmlFree(nval);
		return;
	    }
	} else {
	    val = (xmlChar *) value;
	}

	if (val[0] != 0) {
	    xmlURIPtr uri;

	    uri = xmlParseURI((const char *)val);
	    if (uri == NULL) {
		if ((ctxt->sax != NULL) && (ctxt->sax->warning != NULL))
		    ctxt->sax->warning(ctxt->userData,
			 "xmlns: %s not a valid URI\n", val);
	    } else {
		if (uri->scheme == NULL) {
		    if ((ctxt->sax != NULL) && (ctxt->sax->warning != NULL))
			ctxt->sax->warning(ctxt->userData,
			     "xmlns: URI %s is not absolute\n", val);
		}
		xmlFreeURI(uri);
	    }
	}

	/* a default namespace definition */
	nsret = xmlNewNs(ctxt->node, val, NULL);

#ifdef LIBXML_VALID_ENABLED
	/*
	 * Validate also for namespace decls, they are attributes from
	 * an XML-1.0 perspective
	 */
        if (nsret != NULL && ctxt->validate && ctxt->wellFormed &&
	    ctxt->myDoc && ctxt->myDoc->intSubset)
	    ctxt->valid &= xmlValidateOneNamespace(&ctxt->vctxt, ctxt->myDoc,
					   ctxt->node, prefix, nsret, val);
#endif /* LIBXML_VALID_ENABLED */
	if (name != NULL)
	    xmlFree(name);
	if (nval != NULL)
	    xmlFree(nval);
	if (val != value)
	    xmlFree(val);
	return;
    }
    if ((!ctxt->html) &&
	(ns != NULL) && (ns[0] == 'x') && (ns[1] == 'm') && (ns[2] == 'l') &&
        (ns[3] == 'n') && (ns[4] == 's') && (ns[5] == 0)) {
	xmlNsPtr nsret;
	xmlChar *val;

        if (!ctxt->replaceEntities) {
	    ctxt->depth++;
	    val = xmlStringDecodeEntities(ctxt, value, XML_SUBSTITUTE_REF,
		                          0,0,0);
	    ctxt->depth--;
	    if (val == NULL) {
	        xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElement");
	        xmlFree(ns);
		if (name != NULL)
		    xmlFree(name);
                if (nval != NULL)
                    xmlFree(nval);
		return;
	    }
	} else {
	    val = (xmlChar *) value;
	}

	if (val[0] == 0) {
	    xmlNsErrMsg(ctxt, XML_NS_ERR_EMPTY,
		        "Empty namespace name for prefix %s\n", name, NULL);
	}
	if ((ctxt->pedantic != 0) && (val[0] != 0)) {
	    xmlURIPtr uri;

	    uri = xmlParseURI((const char *)val);
	    if (uri == NULL) {
	        xmlNsWarnMsg(ctxt, XML_WAR_NS_URI,
			 "xmlns:%s: %s not a valid URI\n", name, value);
	    } else {
		if (uri->scheme == NULL) {
		    xmlNsWarnMsg(ctxt, XML_WAR_NS_URI_RELATIVE,
			   "xmlns:%s: URI %s is not absolute\n", name, value);
		}
		xmlFreeURI(uri);
	    }
	}

	/* a standard namespace definition */
	nsret = xmlNewNs(ctxt->node, val, name);
	xmlFree(ns);
#ifdef LIBXML_VALID_ENABLED
	/*
	 * Validate also for namespace decls, they are attributes from
	 * an XML-1.0 perspective
	 */
        if (nsret != NULL && ctxt->validate && ctxt->wellFormed &&
	    ctxt->myDoc && ctxt->myDoc->intSubset)
	    ctxt->valid &= xmlValidateOneNamespace(&ctxt->vctxt, ctxt->myDoc,
					   ctxt->node, prefix, nsret, value);
#endif /* LIBXML_VALID_ENABLED */
	if (name != NULL)
	    xmlFree(name);
	if (nval != NULL)
	    xmlFree(nval);
	if (val != value)
	    xmlFree(val);
	return;
    }

    if (ns != NULL) {
	namespace = xmlSearchNs(ctxt->myDoc, ctxt->node, ns);

	if (namespace == NULL) {
	    xmlNsErrMsg(ctxt, XML_NS_ERR_UNDEFINED_NAMESPACE,
		    "Namespace prefix %s of attribute %s is not defined\n",
		             ns, name);
	} else {
            xmlAttrPtr prop;

            prop = ctxt->node->properties;
            while (prop != NULL) {
                if (prop->ns != NULL) {
                    if ((xmlStrEqual(name, prop->name)) &&
                        ((namespace == prop->ns) ||
                         (xmlStrEqual(namespace->href, prop->ns->href)))) {
                            xmlNsErrMsg(ctxt, XML_ERR_ATTRIBUTE_REDEFINED,
                                    "Attribute %s in %s redefined\n",
                                             name, namespace->href);
                        ctxt->wellFormed = 0;
                        if (ctxt->recovery == 0) ctxt->disableSAX = 1;
                        if (name != NULL)
                            xmlFree(name);
                        goto error;
                    }
                }
                prop = prop->next;
            }
        }
    } else {
	namespace = NULL;
    }

    /* !!!!!! <a toto:arg="" xmlns:toto="http://toto.com"> */
    ret = xmlNewNsPropEatName(ctxt->node, namespace, name, NULL);

    if (ret != NULL) {
        if ((ctxt->replaceEntities == 0) && (!ctxt->html)) {
	    xmlNodePtr tmp;

	    ret->children = xmlStringGetNodeList(ctxt->myDoc, value);
	    tmp = ret->children;
	    while (tmp != NULL) {
		tmp->parent = (xmlNodePtr) ret;
		if (tmp->next == NULL)
		    ret->last = tmp;
		tmp = tmp->next;
	    }
	} else if (value != NULL) {
	    ret->children = xmlNewDocText(ctxt->myDoc, value);
	    ret->last = ret->children;
	    if (ret->children != NULL)
		ret->children->parent = (xmlNodePtr) ret;
	}
    }

#ifdef LIBXML_VALID_ENABLED
    if ((!ctxt->html) && ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset) {

	/*
	 * If we don't substitute entities, the validation should be
	 * done on a value with replaced entities anyway.
	 */
        if (!ctxt->replaceEntities) {
	    xmlChar *val;

	    ctxt->depth++;
	    val = xmlStringDecodeEntities(ctxt, value, XML_SUBSTITUTE_REF,
		                          0,0,0);
	    ctxt->depth--;

	    if (val == NULL)
		ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
				ctxt->myDoc, ctxt->node, ret, value);
	    else {
		xmlChar *nvalnorm;

		/*
		 * Do the last stage of the attribute normalization
		 * It need to be done twice ... it's an extra burden related
		 * to the ability to keep xmlSAX2References in attributes
		 */
		nvalnorm = xmlValidNormalizeAttributeValue(ctxt->myDoc,
					    ctxt->node, fullname, val);
		if (nvalnorm != NULL) {
		    xmlFree(val);
		    val = nvalnorm;
		}

		ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
			        ctxt->myDoc, ctxt->node, ret, val);
                xmlFree(val);
	    }
	} else {
	    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt, ctxt->myDoc,
					       ctxt->node, ret, value);
	}
    } else
#endif /* LIBXML_VALID_ENABLED */
           if (((ctxt->loadsubset & XML_SKIP_IDS) == 0) &&
	       (((ctxt->replaceEntities == 0) && (ctxt->external != 2)) ||
	        ((ctxt->replaceEntities != 0) && (ctxt->inSubset == 0)))) {
        /*
	 * when validating, the ID registration is done at the attribute
	 * validation level. Otherwise we have to do specific handling here.
	 */
	if (xmlStrEqual(fullname, BAD_CAST "xml:id")) {
	    /*
	     * Add the xml:id value
	     *
	     * Open issue: normalization of the value.
	     */
	    if (xmlValidateNCName(value, 1) != 0) {
	        xmlErrValid(ctxt, XML_DTD_XMLID_VALUE,
		      "xml:id : attribute value %s is not an NCName\n",
			    (const char *) value, NULL);
	    }
	    xmlAddID(&ctxt->vctxt, ctxt->myDoc, value, ret);
	} else if (xmlIsID(ctxt->myDoc, ctxt->node, ret))
	    xmlAddID(&ctxt->vctxt, ctxt->myDoc, value, ret);
	else if (xmlIsRef(ctxt->myDoc, ctxt->node, ret))
	    xmlAddRef(&ctxt->vctxt, ctxt->myDoc, value, ret);
    }

error:
    if (nval != NULL)
	xmlFree(nval);
    if (ns != NULL)
	xmlFree(ns);
}